

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImVec2 ImGui::TabItemCalcSize(char *label,bool has_close_button)

{
  float fVar1;
  ImGuiContext *pIVar2;
  undefined7 in_register_00000031;
  float fVar3;
  ImVec2 IVar4;
  float fVar5;
  
  pIVar2 = GImGui;
  IVar4 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar3 = (pIVar2->Style).FramePadding.x;
  fVar1 = (pIVar2->Style).FramePadding.y;
  if ((int)CONCAT71(in_register_00000031,has_close_button) == 0) {
    fVar5 = 1.0;
  }
  else {
    fVar5 = (pIVar2->Style).ItemInnerSpacing.x + pIVar2->FontSize;
  }
  fVar3 = fVar3 + IVar4.x + fVar5 + fVar3;
  fVar5 = GImGui->FontSize * 20.0;
  if (fVar5 <= fVar3) {
    fVar3 = fVar5;
  }
  IVar4.y = fVar1 + fVar1 + IVar4.y;
  IVar4.x = fVar3;
  return IVar4;
}

Assistant:

ImVec2 ImGui::TabItemCalcSize(const char* label, bool has_close_button)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size = ImVec2(label_size.x + g.Style.FramePadding.x, label_size.y + g.Style.FramePadding.y * 2.0f);
    if (has_close_button)
        size.x += g.Style.FramePadding.x + (g.Style.ItemInnerSpacing.x + g.FontSize); // We use Y intentionally to fit the close button circle.
    else
        size.x += g.Style.FramePadding.x + 1.0f;
    return ImVec2(ImMin(size.x, TabBarCalcMaxTabWidth()), size.y);
}